

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O2

size_t __thiscall
adios2::format::BP4Serializer::CloseStream(BP4Serializer *this,IO *io,bool addMetadata)

{
  size_t sVar1;
  long lVar2;
  _func_int *p_Var3;
  mapped_type *pmVar4;
  allocator local_89;
  key_type local_88;
  string local_68;
  string local_48;
  
  p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
  std::__cxx11::string::string((string *)&local_48,"buffering",(allocator *)&local_88);
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var3),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
  if ((&(this->super_BP4Base).field_0x1c0)[(long)p_Var3] == '\x01') {
    SerializeDataBuffer(this,io);
    p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
  }
  sVar1 = *(size_t *)(p_Var3 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  SerializeMetadataInData(this,false,addMetadata);
  p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
  if ((&(this->super_BP4Base).field_0x2e8)[(long)p_Var3] == '\x01') {
    lVar2 = *(long *)(p_Var3 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
    std::__cxx11::string::string((string *)&local_88,"buffering",&local_89);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)(&(this->super_BP4Base).field_0x2b0 + (long)p_Var3),&local_88);
    *pmVar4 = *pmVar4 + lVar2;
    std::__cxx11::string::~string((string *)&local_88);
    p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
  }
  std::__cxx11::string::string((string *)&local_68,"buffering",(allocator *)&local_88);
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var3),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  return sVar1;
}

Assistant:

size_t BP4Serializer::CloseStream(core::IO &io, const bool addMetadata)
{
    m_Profiler.Start("buffering");
    if (m_MetadataSet.DataPGIsOpen)
    {
        SerializeDataBuffer(io);
    }
    size_t dataEndsAt = m_Data.m_Position;
    SerializeMetadataInData(false, addMetadata);

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.at("buffering") += m_Data.m_Position;
    }
    m_Profiler.Stop("buffering");

    return dataEndsAt;
}